

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *__s;
  lua_Integer lVar5;
  char *pcVar6;
  char *__s_00;
  char *pcVar7;
  lua_State *plVar8;
  long lVar9;
  long lVar10;
  ulong n;
  size_t __n;
  bool bVar11;
  size_t l2;
  size_t l1;
  MatchState ms;
  ulong local_260;
  ulong local_258;
  MatchState local_250;
  
  pcVar4 = luaL_checklstring(L,1,&local_258);
  __s = luaL_checklstring(L,2,&local_260);
  lVar5 = luaL_optinteger(L,3,1);
  lVar9 = (lVar5 >> 0x3f & local_258 + 1) + lVar5;
  lVar10 = 0;
  if (0 < lVar9) {
    lVar10 = lVar9;
  }
  n = lVar10 - 1U;
  if (local_258 <= lVar10 - 1U) {
    n = local_258;
  }
  if (lVar9 < 1) {
    n = 0;
  }
  if ((find == 0) ||
     ((iVar2 = lua_toboolean(L,4), iVar2 == 0 &&
      (pcVar6 = strpbrk(__s,"^$*+?.([%-"), pcVar6 != (char *)0x0)))) {
    cVar1 = *__s;
    local_250.src_end = pcVar4 + local_258;
    plVar8 = L;
    pcVar6 = pcVar4 + n;
    local_250.src_init = pcVar4;
    local_250.L = L;
    do {
      n = n + 1;
      local_250.level = 0;
      pcVar7 = match(&local_250,pcVar6,__s + (cVar1 == '^'));
      if (pcVar7 != (char *)0x0) {
        if (find == 0) {
          uVar3 = push_captures(&local_250,pcVar6,pcVar7);
          plVar8 = (lua_State *)(ulong)uVar3;
        }
        else {
          lua_pushinteger(L,n);
          lua_pushinteger(L,(long)pcVar7 - (long)pcVar4);
          iVar2 = push_captures(&local_250,(char *)0x0,(char *)0x0);
          plVar8 = (lua_State *)(ulong)(iVar2 + 2);
        }
      }
      if (pcVar7 != (char *)0x0) {
        return (int)plVar8;
      }
    } while ((cVar1 != '^') && (bVar11 = pcVar6 < local_250.src_end, pcVar6 = pcVar6 + 1, bVar11));
  }
  else {
    pcVar6 = pcVar4 + n;
    if (local_260 != 0) {
      if (local_260 <= local_258 - n) {
        __n = local_260 - 1;
        pcVar7 = (char *)((local_258 - n) - __n);
        if (pcVar7 != (char *)0x0) {
          cVar1 = *__s;
          __s_00 = pcVar6;
          do {
            pcVar6 = (char *)memchr(__s_00,(int)cVar1,(size_t)pcVar7);
            if (pcVar6 == (char *)0x0) break;
            __s1 = pcVar6 + 1;
            iVar2 = bcmp(__s1,__s + 1,__n);
            if (iVar2 == 0) goto LAB_0011790d;
            pcVar7 = __s_00 + ((long)pcVar7 - (long)__s1);
            __s_00 = __s1;
          } while (pcVar7 != (char *)0x0);
        }
      }
      pcVar6 = (char *)0x0;
    }
LAB_0011790d:
    if (pcVar6 != (char *)0x0) {
      lua_pushinteger(L,(lua_Integer)(pcVar6 + (1 - (long)pcVar4)));
      lua_pushinteger(L,(lua_Integer)(pcVar6 + (local_260 - (long)pcVar4)));
      return 2;
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int str_find_aux (lua_State *L, int find) {
  size_t l1, l2;
  const char *s = luaL_checklstring(L, 1, &l1);
  const char *p = luaL_checklstring(L, 2, &l2);
  ptrdiff_t init = posrelat(luaL_optinteger(L, 3, 1), l1) - 1;
  if (init < 0) init = 0;
  else if ((size_t)(init) > l1) init = (ptrdiff_t)l1;
  if (find && (lua_toboolean(L, 4) ||  /* explicit request? */
      strpbrk(p, SPECIALS) == NULL)) {  /* or no special characters? */
    /* do a plain search */
    const char *s2 = lmemfind(s+init, l1-init, p, l2);
    if (s2) {
      lua_pushinteger(L, s2-s+1);
      lua_pushinteger(L, s2-s+l2);
      return 2;
    }
  }
  else {
    MatchState ms;
    int anchor = (*p == '^') ? (p++, 1) : 0;
    const char *s1=s+init;
    ms.L = L;
    ms.src_init = s;
    ms.src_end = s+l1;
    do {
      const char *res;
      ms.level = 0;
      if ((res=match(&ms, s1, p)) != NULL) {
        if (find) {
          lua_pushinteger(L, s1-s+1);  /* start */
          lua_pushinteger(L, res-s);   /* end */
          return push_captures(&ms, NULL, 0) + 2;
        }
        else
          return push_captures(&ms, s1, res);
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  lua_pushnil(L);  /* not found */
  return 1;
}